

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_module.cpp
# Opt level: O2

void update_shared_ptr(shared_ptr<TestBaseType> *ptr)

{
  __shared_ptr<TestDerivedType,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_shared<TestDerivedType>();
  std::__shared_ptr<TestBaseType,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TestBaseType,(__gnu_cxx::_Lock_policy)2> *)ptr,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

void update_shared_ptr(std::shared_ptr<TestBaseType> &ptr) {
  ptr = std::make_shared<TestDerivedType>();
}